

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-entity.cpp
# Opt level: O1

void __thiscall constructor::test_method(constructor *this)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  string *psVar3;
  string *local_150;
  string *local_148;
  undefined8 **local_140;
  undefined1 local_138;
  undefined8 *local_130;
  string **local_128;
  undefined8 **local_120;
  undefined1 local_118;
  undefined8 *local_110;
  string **local_108;
  Entity *local_100;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  shared_count sStack_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x25);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010ab88;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  iVar1 = std::__cxx11::string::compare((char *)&CustomEntity::CLASS_NAME_abi_cxx11_);
  local_f8[0] = iVar1 == 0;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_b8 = "";
  local_108 = &local_148;
  local_148 = &CustomEntity::CLASS_NAME_abi_cxx11_;
  local_118 = 0;
  local_120 = (undefined8 **)&PTR__lazy_ostream_0010ac00;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &local_150;
  local_150 = (string *)0x108025;
  local_138 = 0;
  local_140 = (undefined8 **)&PTR__lazy_ostream_0010ac40;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_e0,&local_c0,0x25,1,2,2,"CustomEntity::CLASS_NAME",&local_120,
             "\"CustomEntity\"",&local_140);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  psVar2 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_120 = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"CustomEntity","");
  local_140 = &local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"my-entity","");
  local_100 = (Entity *)dynamicgraph::FactoryStorage::newEntity(psVar2,(string *)&local_120);
  if (local_140 != &local_130) {
    operator_delete(local_140,(long)local_130 + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,(long)local_110 + 1);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x2a);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010ab88;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  psVar3 = (string *)(local_100 + 8);
  iVar1 = std::__cxx11::string::compare((char *)psVar3);
  local_f8[0] = iVar1 == 0;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_b8 = "";
  local_118 = 0;
  local_120 = (undefined8 **)&PTR__lazy_ostream_0010ac00;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = &local_148;
  local_150 = (string *)0x1080cf;
  local_138 = 0;
  local_140 = (undefined8 **)&PTR__lazy_ostream_0010ac80;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &local_150;
  local_148 = psVar3;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_e0,&local_c0,0x2a,1,2,2,"entity->getName()",&local_120,"\"my-entity\"",
             &local_140);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x2b);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010ab88;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  psVar3 = dynamicgraph::Entity::getClassName_abi_cxx11_(local_100);
  iVar1 = std::__cxx11::string::compare((char *)psVar3);
  local_f8[0] = iVar1 == 0;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_b8 = "";
  local_118 = 0;
  local_120 = (undefined8 **)&PTR__lazy_ostream_0010ac00;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = &local_148;
  local_150 = (string *)0x10802b;
  local_138 = 0;
  local_140 = (undefined8 **)&PTR__lazy_ostream_0010acc0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &local_150;
  local_148 = psVar3;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_e0,&local_c0,0x2b,1,2,2,"entity->Entity::getClassName()",&local_120,
             "\"Entity\"",&local_140);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2c);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010ab88;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  psVar3 = (string *)(**(code **)(*(long *)local_100 + 0x10))();
  __n = psVar3->_M_string_length;
  if (__n == CustomEntity::CLASS_NAME_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      local_f8[0] = true;
    }
    else {
      iVar1 = bcmp((psVar3->_M_dataplus)._M_p,CustomEntity::CLASS_NAME_abi_cxx11_._M_dataplus._M_p,
                   __n);
      local_f8[0] = iVar1 == 0;
    }
  }
  else {
    local_f8[0] = false;
  }
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/custom-entity.cpp"
  ;
  local_b8 = "";
  local_118 = 0;
  local_120 = (undefined8 **)&PTR__lazy_ostream_0010ac00;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = &local_148;
  local_150 = &CustomEntity::CLASS_NAME_abi_cxx11_;
  local_138 = 0;
  local_140 = (undefined8 **)&PTR__lazy_ostream_0010ac00;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &local_150;
  local_148 = psVar3;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_e0,&local_c0,0x2c,1,2,2,"entity->getClassName()",&local_120,
             "CustomEntity::CLASS_NAME",&local_140);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  dynamicgraph::PoolStorage::destroy();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(constructor) {
  BOOST_CHECK_EQUAL(CustomEntity::CLASS_NAME, "CustomEntity");

  dynamicgraph::Entity *entity =
      dynamicgraph::FactoryStorage::getInstance()->newEntity("CustomEntity",
                                                             "my-entity");
  BOOST_CHECK_EQUAL(entity->getName(), "my-entity");
  BOOST_CHECK_EQUAL(entity->Entity::getClassName(), "Entity");
  BOOST_CHECK_EQUAL(entity->getClassName(), CustomEntity::CLASS_NAME);

  // CustomEntity entity2 ("");
  // Deregister entities before destroying them
  dynamicgraph::PoolStorage::destroy();
}